

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O1

int32_t ucnv_getCCSID_63(UConverter *converter,UErrorCode *err)

{
  int iVar1;
  UConverterGetName p_Var2;
  char *pcVar3;
  long lVar4;
  int32_t iVar5;
  
  if (U_ZERO_ERROR < *err) {
    return -1;
  }
  iVar1 = converter->sharedData->staticData->codepage;
  if (iVar1 == 0) {
    p_Var2 = converter->sharedData->impl->getName;
    if ((p_Var2 == (UConverterGetName)0x0) || (pcVar3 = (*p_Var2)(converter), pcVar3 == (char *)0x0)
       ) {
      pcVar3 = converter->sharedData->staticData->name;
    }
    pcVar3 = ucnv_getStandardName_63(pcVar3,"IBM",err);
    iVar5 = 0;
    if (((*err < U_ILLEGAL_ARGUMENT_ERROR) && (pcVar3 != (char *)0x0)) &&
       (pcVar3 = strchr(pcVar3,0x2d), pcVar3 != (char *)0x0)) {
      lVar4 = atol(pcVar3 + 1);
      iVar5 = (int32_t)lVar4;
    }
    return iVar5;
  }
  return iVar1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucnv_getCCSID(const UConverter * converter,
              UErrorCode * err)
{
    int32_t ccsid;
    if (U_FAILURE (*err))
        return -1;

    ccsid = converter->sharedData->staticData->codepage;
    if (ccsid == 0) {
        /* Rare case. This is for cases like gb18030,
        which doesn't have an IBM canonical name, but does have an IBM alias. */
        const char *standardName = ucnv_getStandardName(ucnv_getName(converter, err), "IBM", err);
        if (U_SUCCESS(*err) && standardName) {
            const char *ccsidStr = uprv_strchr(standardName, '-');
            if (ccsidStr) {
                ccsid = (int32_t)atol(ccsidStr+1);  /* +1 to skip '-' */
            }
        }
    }
    return ccsid;
}